

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

int Curl_pgrsUpdate(connectdata *conn)

{
  int *piVar1;
  uint uVar2;
  Curl_easy *data;
  FILE *whereto;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  long seconds;
  int iVar7;
  long lVar8;
  timediff_t tVar9;
  long lVar10;
  curl_off_t cVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  curltime cVar19;
  curltime older;
  curltime newer;
  curltime newer_00;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  if (((data->progress).flags & 0x10) == 0) {
    if ((data->set).fxferinfo != (curl_xferinfo_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar7 = (*(data->set).fxferinfo)
                        ((data->set).progress_client,(data->progress).size_dl,
                         (data->progress).downloaded,(data->progress).size_ul,
                         (data->progress).uploaded);
LAB_004b8be9:
      Curl_set_in_callback(data,false);
      if (iVar7 == 0) {
        return 0;
      }
      Curl_failf(data,"Callback aborted");
      return iVar7;
    }
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar7 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_004b8be9;
    }
  }
  lVar15 = (data->progress).downloaded;
  lVar12 = (data->progress).uploaded;
  cVar19 = Curl_now();
  lVar8 = cVar19.tv_sec;
  uVar4 = (data->progress).start.tv_sec;
  uVar5 = (data->progress).start.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  older._12_4_ = 0;
  auVar3 = cVar19._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar3._0_8_;
  newer.tv_usec = auVar3._8_4_;
  tVar9 = Curl_timediff_us(newer,older);
  seconds = tVar9 / 1000000;
  lVar14 = 999999;
  if (lVar15 < 0x20c49ba5e353f7) {
    lVar14 = 999;
  }
  (data->progress).timespent = tVar9;
  lVar17 = seconds;
  if (lVar15 < 0x20c49ba5e353f7) {
    lVar17 = tVar9 / 1000;
  }
  lVar18 = 999999;
  lVar10 = lVar15 * 1000;
  if (0x20c49ba5e353f6 < lVar15) {
    lVar10 = lVar15;
  }
  if (tVar9 <= lVar14) {
    lVar17 = 1;
  }
  lVar15 = seconds;
  if (lVar12 < 0x20c49ba5e353f7) {
    lVar18 = 999;
    lVar12 = lVar12 * 1000;
    lVar15 = tVar9 / 1000;
  }
  (data->progress).dlspeed = lVar10 / lVar17;
  if (tVar9 <= lVar18) {
    lVar15 = 1;
  }
  (data->progress).ulspeed = lVar12 / lVar15;
  if ((data->progress).lastshow == lVar8) {
    return 0;
  }
  iVar7 = (data->progress).speeder_c;
  iVar13 = iVar7 % 6;
  uVar2 = (data->progress).flags;
  (data->progress).lastshow = lVar8;
  (data->progress).speeder[iVar13] = (data->progress).uploaded + (data->progress).downloaded;
  (data->progress).speeder_time[iVar13].tv_sec = lVar8;
  (data->progress).speeder_time[iVar13].tv_usec = cVar19.tv_usec;
  (data->progress).speeder_c = iVar7 + 1U;
  if (iVar7 == 0) {
    cVar11 = (data->progress).dlspeed + (data->progress).ulspeed;
  }
  else {
    uVar6 = 0;
    if (4 < iVar7) {
      uVar6 = (iVar7 + 1U) % 6;
    }
    cVar19.tv_usec =
         *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + (ulong)(uVar6 << 4));
    cVar19.tv_sec =
         *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + (ulong)(uVar6 << 4));
    cVar19._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar3._0_8_;
    newer_00.tv_usec = auVar3._8_4_;
    tVar9 = Curl_timediff(newer_00,cVar19);
    lVar12 = tVar9 + (ulong)(tVar9 == 0);
    lVar15 = (data->progress).speeder[iVar13] - (data->progress).speeder[uVar6];
    if (lVar15 < 0x418938) {
      cVar11 = (lVar15 * 1000) / lVar12;
    }
    else {
      cVar11 = (curl_off_t)((double)lVar15 / ((double)lVar12 / 1000.0));
    }
  }
  (data->progress).current_speed = cVar11;
  if ((uVar2 & 0x10) != 0) {
    return 0;
  }
  if (((data->progress).flags & 0x80) == 0) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    piVar1 = &(data->progress).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 0x80;
  }
  uVar2 = (data->progress).flags;
  if (((uVar2 & 0x20) == 0) || (lVar15 = (data->progress).ulspeed, lVar15 < 1)) {
    local_a8 = 0;
    lVar15 = 0;
  }
  else {
    uVar16 = (data->progress).size_ul;
    lVar15 = (long)uVar16 / lVar15;
    if ((long)uVar16 < 0x2711) {
      if ((long)uVar16 < 1) {
        local_a8 = 0;
        goto LAB_004b8f03;
      }
      cVar11 = (data->progress).uploaded * 100;
    }
    else {
      cVar11 = (data->progress).uploaded;
      uVar16 = uVar16 / 100;
    }
    local_a8 = cVar11 / (long)uVar16;
  }
LAB_004b8f03:
  if (((uVar2 & 0x40) == 0) || (lVar12 = (data->progress).dlspeed, lVar12 < 1)) {
    local_a0 = 0;
    lVar12 = 0;
  }
  else {
    uVar16 = (data->progress).size_dl;
    lVar12 = (long)uVar16 / lVar12;
    if ((long)uVar16 < 0x2711) {
      if ((long)uVar16 < 1) {
        local_a0 = 0;
        goto LAB_004b8f80;
      }
      cVar11 = (data->progress).downloaded * 100;
    }
    else {
      cVar11 = (data->progress).downloaded;
      uVar16 = uVar16 / 100;
    }
    local_a0 = cVar11 / (long)uVar16;
  }
LAB_004b8f80:
  if (lVar12 < lVar15) {
    lVar12 = lVar15;
  }
  cVar11 = 0;
  if (0 < lVar12) {
    cVar11 = lVar12 - seconds;
  }
  time2str(time_left,cVar11);
  time2str(time_total,lVar12);
  time2str(local_96,seconds);
  uVar2 = (data->progress).flags;
  uVar16 = (&(data->progress).size_dl)[(ulong)((uVar2 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar2 & 0x20) == 0) * 2];
  lVar15 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar16 < 0x2711) {
    if ((long)uVar16 < 1) {
      lVar15 = 0;
    }
    else {
      lVar15 = (lVar15 * 100) / (long)uVar16;
    }
  }
  else {
    lVar15 = lVar15 / (long)(uVar16 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar16,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar15,max5 + 2,local_a0,
                max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
  }
  progress_meter(conn);

  return 0;
}